

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_NodeSimulate(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  Ivy_Obj_t *pIVar1;
  long lVar2;
  Ivy_Obj_t *pObj_00;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  if (((ulong)pObj & 1) == 0) {
    pIVar1 = pObj->pFanout;
    lVar2 = *(long *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x20);
    pObj_00 = pObj->pFanin1;
    lVar3 = *(long *)(((ulong)pObj_00 & 0xfffffffffffffffe) + 0x20);
    uVar7 = *(uint *)&pObj->field_0x8 >> 7;
    iVar4 = Ivy_ObjFaninPhase(pObj->pFanin0);
    iVar5 = Ivy_ObjFaninPhase(pObj_00);
    if (iVar5 == 0 || iVar4 == 0) {
      if (iVar4 == 0 || iVar5 != 0) {
        if (iVar5 == 0 || iVar4 != 0) {
          lVar6 = 0;
          if ((uVar7 & 1) == 0) {
            for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
              *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
                   *(uint *)(lVar3 + 0x20 + lVar6 * 4) & *(uint *)(lVar2 + 0x20 + lVar6 * 4);
            }
          }
          else {
            for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
              *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
                   ~(*(uint *)(lVar3 + 0x20 + lVar6 * 4) & *(uint *)(lVar2 + 0x20 + lVar6 * 4));
            }
          }
        }
        else {
          lVar6 = 0;
          if ((uVar7 & 1) == 0) {
            for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
              *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
                   ~*(uint *)(lVar3 + 0x20 + lVar6 * 4) & *(uint *)(lVar2 + 0x20 + lVar6 * 4);
            }
          }
          else {
            for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
              *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
                   ~*(uint *)(lVar2 + 0x20 + lVar6 * 4) | *(uint *)(lVar3 + 0x20 + lVar6 * 4);
            }
          }
        }
      }
      else {
        lVar6 = 0;
        if ((uVar7 & 1) == 0) {
          for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
            *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
                 ~*(uint *)(lVar2 + 0x20 + lVar6 * 4) & *(uint *)(lVar3 + 0x20 + lVar6 * 4);
          }
        }
        else {
          for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
            *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
                 ~*(uint *)(lVar3 + 0x20 + lVar6 * 4) | *(uint *)(lVar2 + 0x20 + lVar6 * 4);
          }
        }
      }
    }
    else {
      lVar6 = 0;
      if ((uVar7 & 1) == 0) {
        for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
          *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
               ~(*(uint *)(lVar3 + 0x20 + lVar6 * 4) | *(uint *)(lVar2 + 0x20 + lVar6 * 4));
        }
      }
      else {
        for (; lVar6 < p->nSimWords; lVar6 = lVar6 + 1) {
          *(uint *)((long)&pIVar1->pFanout + lVar6 * 4) =
               *(uint *)(lVar3 + 0x20 + lVar6 * 4) | *(uint *)(lVar2 + 0x20 + lVar6 * 4);
        }
      }
    }
    return;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0x37c,"void Ivy_NodeSimulate(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_NodeSimulate( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims, * pSims0, * pSims1;
    int fCompl, fCompl0, fCompl1, i;
    assert( !Ivy_IsComplement(pObj) );
    // get hold of the simulation information
    pSims  = Ivy_ObjSim(pObj);
    pSims0 = Ivy_ObjSim(Ivy_ObjFanin0(pObj));
    pSims1 = Ivy_ObjSim(Ivy_ObjFanin1(pObj));
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj));
    fCompl1 = Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj));
    // simulate
    if ( fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] | pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = ~(pSims0->pData[i] | pSims1->pData[i]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] | ~pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (~pSims0->pData[i] & pSims1->pData[i]);
    }
    else if ( !fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (~pSims0->pData[i] | pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] & ~pSims1->pData[i]);
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = ~(pSims0->pData[i] & pSims1->pData[i]);
        else
            for ( i = 0; i < p->nSimWords; i++ )
                pSims->pData[i] = (pSims0->pData[i] & pSims1->pData[i]);
    }
}